

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

int hdr_log_write_entry(hdr_log_writer *writer,FILE *file,hdr_log_entry *entry,
                       hdr_histogram *histogram)

{
  ulong uVar1;
  hdr_log_entry *__stream;
  int iVar2;
  int iVar3;
  size_t output_len;
  char *pcVar4;
  char *pcVar5;
  int64_t iVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  char *local_80;
  char *tag_separator;
  char *tag_value;
  char *tag_prefix;
  int has_tag;
  size_t encoded_len;
  int result;
  int rc;
  char *encoded_histogram;
  size_t compressed_len;
  uint8_t *compressed_histogram;
  hdr_histogram *histogram_local;
  hdr_log_entry *entry_local;
  FILE *file_local;
  hdr_log_writer *writer_local;
  
  compressed_len = 0;
  encoded_histogram = (char *)0x0;
  _result = (char *)0x0;
  encoded_len._0_4_ = 0;
  compressed_histogram = (uint8_t *)histogram;
  histogram_local = (hdr_histogram *)entry;
  entry_local = (hdr_log_entry *)file;
  file_local = (FILE *)writer;
  iVar2 = hdr_encode_compressed(histogram,(uint8_t **)&compressed_len,(size_t *)&encoded_histogram);
  if (iVar2 == 0) {
    output_len = hdr_base64_encoded_len((size_t)encoded_histogram);
    _result = (char *)calloc(output_len + 1,1);
    iVar2 = hdr_base64_encode((uint8_t *)compressed_len,(size_t)encoded_histogram,_result,output_len
                             );
    __stream = entry_local;
    if (iVar2 == 0) {
      bVar7 = false;
      if (histogram_local->min_value != 0) {
        bVar7 = histogram_local->max_value != 0;
      }
      pcVar4 = "";
      if (bVar7) {
        pcVar4 = "Tag=";
        local_80 = (char *)histogram_local->min_value;
      }
      else {
        local_80 = "";
      }
      pcVar5 = "";
      if (bVar7) {
        pcVar5 = ",";
      }
      uVar1 = histogram_local->max_value;
      dVar8 = hdr_timespec_as_double((hdr_timespec *)histogram_local);
      dVar9 = hdr_timespec_as_double((hdr_timespec *)&histogram_local->unit_magnitude);
      iVar6 = hdr_max((hdr_histogram *)compressed_histogram);
      iVar3 = fprintf((FILE *)__stream,"%s%.*s%s%.3f,%.3f,%lu.0,%s\n",dVar8,dVar9,pcVar4,
                      uVar1 & 0xffffffff,local_80,pcVar5,iVar6,_result);
      iVar2 = (int)encoded_len;
      if (iVar3 < 0) {
        encoded_len._0_4_ = 5;
        iVar2 = (int)encoded_len;
      }
    }
  }
  encoded_len._0_4_ = iVar2;
  free((void *)compressed_len);
  free(_result);
  return (int)encoded_len;
}

Assistant:

int hdr_log_write_entry(
    struct hdr_log_writer* writer,
    FILE* file,
    struct hdr_log_entry* entry,
    struct hdr_histogram* histogram)
{
    uint8_t* compressed_histogram = NULL;
    size_t compressed_len = 0;
    char* encoded_histogram = NULL;
    int rc = 0;
    int result = 0;
    size_t encoded_len;
    int has_tag = 0;
    const char* tag_prefix;
    const char* tag_value;
    const char* tag_separator;

    (void)writer;

    rc = hdr_encode_compressed(histogram, &compressed_histogram, &compressed_len);
    if (rc != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    encoded_len = hdr_base64_encoded_len(compressed_len);
    encoded_histogram = (char*) hdr_calloc(encoded_len + 1, sizeof(char));

    rc = hdr_base64_encode(
        compressed_histogram, compressed_len, encoded_histogram, encoded_len);
    if (rc != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    has_tag = NULL != entry->tag && 0 < entry->tag_len;
    tag_prefix = has_tag ? "Tag=" : "";
    tag_value = has_tag ? entry->tag : "";
    tag_separator = has_tag ? "," : "";

    if (fprintf(
        file, "%s%.*s%s%.3f,%.3f,%" PRIu64 ".0,%s\n",
        tag_prefix, (int) entry->tag_len, tag_value, tag_separator,
        hdr_timespec_as_double(&entry->start_timestamp),
        hdr_timespec_as_double(&entry->interval),
        hdr_max(histogram),
        encoded_histogram) < 0)
    {
        result = EIO;
    }

    cleanup:
    hdr_free(compressed_histogram);
    hdr_free(encoded_histogram);

    return result;
}